

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanosvgrast.h
# Opt level: O0

void nsvg__initPaint(NSVGcachedPaint *cache,NSVGpaint *paint,float opacity)

{
  NSVGgradient *pNVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  int local_50;
  int count;
  int ib;
  int ia;
  float u;
  float du;
  float ub;
  float ua;
  uint cb;
  uint ca;
  NSVGgradient *grad;
  int local_20;
  int j;
  int i;
  float opacity_local;
  NSVGpaint *paint_local;
  NSVGcachedPaint *cache_local;
  
  cache->type = paint->type;
  if (paint->type == '\x01') {
    uVar2 = nsvg__applyOpacity((paint->field_1).color,opacity);
    cache->colors[0] = uVar2;
  }
  else {
    pNVar1 = (paint->field_1).gradient;
    cache->spread = pNVar1->spread;
    *(undefined8 *)cache->xform = *(undefined8 *)pNVar1->xform;
    *(undefined8 *)(cache->xform + 2) = *(undefined8 *)(pNVar1->xform + 2);
    *(undefined8 *)(cache->xform + 4) = *(undefined8 *)(pNVar1->xform + 4);
    if (pNVar1->nstops == 0) {
      for (local_20 = 0; local_20 < 0x100; local_20 = local_20 + 1) {
        cache->colors[local_20] = 0;
      }
    }
    if (pNVar1->nstops == 1) {
      for (local_20 = 0; local_20 < 0x100; local_20 = local_20 + 1) {
        uVar2 = nsvg__applyOpacity(pNVar1->stops[local_20].color,opacity);
        cache->colors[local_20] = uVar2;
      }
    }
    else {
      ub = 0.0;
      uVar2 = nsvg__applyOpacity(pNVar1->stops[0].color,opacity);
      fVar5 = nsvg__clampf(pNVar1->stops[0].offset,0.0,1.0);
      fVar6 = nsvg__clampf(pNVar1->stops[pNVar1->nstops + -1].offset,fVar5,1.0);
      local_50 = (int)(fVar6 * 255.0);
      for (local_20 = 0; local_20 < (int)(fVar5 * 255.0); local_20 = local_20 + 1) {
        cache->colors[local_20] = uVar2;
      }
      for (local_20 = 0; local_20 < pNVar1->nstops + -1; local_20 = local_20 + 1) {
        uVar2 = nsvg__applyOpacity(pNVar1->stops[local_20].color,opacity);
        ub = (float)nsvg__applyOpacity(pNVar1->stops[local_20 + 1].color,opacity);
        fVar5 = nsvg__clampf(pNVar1->stops[local_20].offset,0.0,1.0);
        fVar6 = nsvg__clampf(pNVar1->stops[local_20 + 1].offset,0.0,1.0);
        local_50 = (int)(fVar6 * 255.0);
        iVar3 = local_50 - (int)(fVar5 * 255.0);
        if (0 < iVar3) {
          ib = 0;
          for (grad._4_4_ = 0; grad._4_4_ < iVar3; grad._4_4_ = grad._4_4_ + 1) {
            uVar4 = nsvg__lerpRGBA(uVar2,(uint)ub,(float)ib);
            cache->colors[(int)(fVar5 * 255.0) + grad._4_4_] = uVar4;
            ib = (int)(1.0 / (float)iVar3 + (float)ib);
          }
        }
      }
      for (local_20 = local_50; local_20 < 0x100; local_20 = local_20 + 1) {
        cache->colors[local_20] = (uint)ub;
      }
    }
  }
  return;
}

Assistant:

static void nsvg__initPaint(NSVGcachedPaint* cache, NSVGpaint* paint, float opacity)
{
	int i, j;
	NSVGgradient* grad;

	cache->type = paint->type;

	if (paint->type == NSVG_PAINT_COLOR) {
		cache->colors[0] = nsvg__applyOpacity(paint->color, opacity);
		return;
	}

	grad = paint->gradient;

	cache->spread = grad->spread;
	memcpy(cache->xform, grad->xform, sizeof(float)*6);

	if (grad->nstops == 0) {
		for (i = 0; i < 256; i++)
			cache->colors[i] = 0;
	} if (grad->nstops == 1) {
		for (i = 0; i < 256; i++)
			cache->colors[i] = nsvg__applyOpacity(grad->stops[i].color, opacity);
	} else {
		unsigned int ca, cb = 0;
		float ua, ub, du, u;
		int ia, ib, count;

		ca = nsvg__applyOpacity(grad->stops[0].color, opacity);
		ua = nsvg__clampf(grad->stops[0].offset, 0, 1);
		ub = nsvg__clampf(grad->stops[grad->nstops-1].offset, ua, 1);
		ia = (int)(ua * 255.0f);
		ib = (int)(ub * 255.0f);
		for (i = 0; i < ia; i++) {
			cache->colors[i] = ca;
		}

		for (i = 0; i < grad->nstops-1; i++) {
			ca = nsvg__applyOpacity(grad->stops[i].color, opacity);
			cb = nsvg__applyOpacity(grad->stops[i+1].color, opacity);
			ua = nsvg__clampf(grad->stops[i].offset, 0, 1);
			ub = nsvg__clampf(grad->stops[i+1].offset, 0, 1);
			ia = (int)(ua * 255.0f);
			ib = (int)(ub * 255.0f);
			count = ib - ia;
			if (count <= 0) continue;
			u = 0;
			du = 1.0f / (float)count;
			for (j = 0; j < count; j++) {
				cache->colors[ia+j] = nsvg__lerpRGBA(ca,cb,u);
				u += du;
			}
		}

		for (i = ib; i < 256; i++)
			cache->colors[i] = cb;
	}

}